

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

FrameDisplay * __thiscall
Js::InterpreterStackFrame::NewFrameDisplay(InterpreterStackFrame *this,void *argHead,void *argEnv)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  uint16 uVar4;
  uint16 uVar5;
  FrameDisplay *pFVar6;
  ScriptContext *scriptContext;
  undefined4 *puVar7;
  void *item;
  uint local_38;
  uint i;
  bool strict;
  FrameDisplay *frameDisplay;
  void *argEnv_local;
  void *argHead_local;
  InterpreterStackFrame *this_local;
  
  bVar2 = ParseableFunctionInfo::GetIsStrictMode(*(ParseableFunctionInfo **)(this + 0x88));
  bVar3 = FunctionBody::DoStackFrameDisplay(*(FunctionBody **)(this + 0x88));
  if ((bVar3) && (pFVar6 = GetLocalFrameDisplay(this), pFVar6 != (FrameDisplay *)0x0)) {
    this_local = (InterpreterStackFrame *)GetLocalFrameDisplay(this);
    if ((FrameDisplay *)this_local == (FrameDisplay *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1d22,"(frameDisplay != nullptr)","frameDisplay != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    FrameDisplay::SetTag((FrameDisplay *)this_local,true);
    FrameDisplay::SetStrictMode((FrameDisplay *)this_local,bVar2);
    uVar4 = FunctionBody::GetEnvDepth(*(FunctionBody **)(this + 0x88));
    FrameDisplay::SetLength((FrameDisplay *)this_local,uVar4 + 1);
    uVar4 = FrameDisplay::GetLength((FrameDisplay *)this_local);
    uVar5 = FrameDisplay::GetLength((FrameDisplay *)argEnv);
    if ((uint)uVar4 != uVar5 + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x1d27,
                                  "(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1)"
                                  ,
                                  "frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    for (local_38 = 0; uVar4 = FrameDisplay::GetLength((FrameDisplay *)argEnv), local_38 < uVar4;
        local_38 = local_38 + 1) {
      item = FrameDisplay::GetItem((FrameDisplay *)argEnv,local_38);
      FrameDisplay::SetItem((FrameDisplay *)this_local,local_38 + 1,item);
    }
    FrameDisplay::SetItem((FrameDisplay *)this_local,0,argHead);
  }
  else {
    scriptContext = GetScriptContext(this);
    this_local = (InterpreterStackFrame *)
                 OP_LdFrameDisplaySetLocal(this,argHead,argEnv,scriptContext);
  }
  return (FrameDisplay *)this_local;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::NewFrameDisplay(void *argHead, void *argEnv)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        if (!this->m_functionBody->DoStackFrameDisplay() || !this->GetLocalFrameDisplay())
        {
            // Null local frame display probably indicates that we bailed out of an inlinee.
            // Once we support stack closures in inlined functions, we can just assert that this value
            // is never null if we should be allocating on the stack.
            return this->OP_LdFrameDisplaySetLocal(argHead, argEnv, this->GetScriptContext());
        }

        frameDisplay = this->GetLocalFrameDisplay();
        Assert(frameDisplay != nullptr);

        frameDisplay->SetTag(true);
        frameDisplay->SetStrictMode(strict);
        frameDisplay->SetLength(this->m_functionBody->GetEnvDepth() + 1);
        Assert(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1);

        for (uint i = 0; i < ((FrameDisplay*)argEnv)->GetLength(); i++)
        {
            frameDisplay->SetItem(i + 1, ((FrameDisplay*)argEnv)->GetItem(i));
        }
        frameDisplay->SetItem(0, argHead);

        return frameDisplay;
    }